

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::opt::anon_unknown_0::GetWordsFromNumericScalarOrVectorConstant
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ConstantManager *const_mgr,Constant *c)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  ScalarConstant *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t val;
  long *plVar5;
  Constant *c_00;
  Constant *extraout_RDX;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  FloatProxy<double> result;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  this = (ScalarConstant *)
         (*(code *)(const_mgr->ctx_->instr_to_block_)._M_h._M_bucket_count)(const_mgr);
  if (this == (ScalarConstant *)0x0) {
    this = (ScalarConstant *)
           (*(code *)(const_mgr->ctx_->instr_to_block_)._M_h._M_buckets)(const_mgr);
    if (this == (ScalarConstant *)0x0) {
      plVar5 = (long *)(*(code *)(const_mgr->ctx_->instr_to_block_)._M_h._M_rehash_policy.
                                 _M_next_resize)(const_mgr);
      if (plVar5 != (long *)0x0) {
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        auVar7 = (**(code **)(*plVar5 + 0xc0))(plVar5);
        c_00 = auVar7._8_8_;
        puVar1 = (undefined8 *)auVar7._0_8_[1];
        for (puVar6 = (undefined8 *)*auVar7._0_8_; puVar6 != puVar1; puVar6 = puVar6 + 1) {
          GetWordsFromNumericScalarOrVectorConstant
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
                     (ConstantManager *)*puVar6,c_00);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     (const_iterator)
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )local_38._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )local_38._M_impl.super__Vector_impl_data._M_finish);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
          c_00 = extraout_RDX;
        }
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    iVar2 = (*((this->super_Constant).type_)->_vptr_Type[10])();
    iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x24);
    uVar3 = iVar2 << 0x1d | iVar2 - 8U >> 3;
    if ((1 < uVar3) && (uVar3 != 3)) {
      if (uVar3 == 7) {
        val = analysis::Constant::GetU64((Constant *)this);
        ExtractInts(__return_storage_ptr__,val);
        return __return_storage_ptr__;
      }
      __assert_fail("width == 8 || width == 16 || width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x90,
                    "std::vector<uint32_t> spvtools::opt::(anonymous namespace)::GetWordsFromScalarIntConstant(const analysis::IntConstant *)"
                   );
    }
  }
  else {
    iVar2 = (*((this->super_Constant).type_)->_vptr_Type[0xc])();
    iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0x24);
    if ((iVar2 != 0x10) && (iVar2 != 0x20)) {
      if (iVar2 == 0x40) {
        local_38._M_impl.super__Vector_impl_data._M_start =
             (pointer)analysis::Constant::GetDouble((Constant *)this);
        utils::FloatProxy<double>::GetWords(__return_storage_ptr__,(FloatProxy<double> *)&local_38);
        return __return_storage_ptr__;
      }
      __assert_fail("width == 16 || width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x9e,
                    "std::vector<uint32_t> spvtools::opt::(anonymous namespace)::GetWordsFromScalarFloatConstant(const analysis::FloatConstant *)"
                   );
    }
  }
  uVar4 = analysis::ScalarConstant::GetU32BitValue(this);
  local_38._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_38._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetWordsFromNumericScalarOrVectorConstant(
    analysis::ConstantManager* const_mgr, const analysis::Constant* c) {
  if (const auto* float_constant = c->AsFloatConstant()) {
    return GetWordsFromScalarFloatConstant(float_constant);
  } else if (const auto* int_constant = c->AsIntConstant()) {
    return GetWordsFromScalarIntConstant(int_constant);
  } else if (const auto* vec_constant = c->AsVectorConstant()) {
    std::vector<uint32_t> words;
    for (const auto* comp : vec_constant->GetComponents()) {
      auto comp_in_words =
          GetWordsFromNumericScalarOrVectorConstant(const_mgr, comp);
      words.insert(words.end(), comp_in_words.begin(), comp_in_words.end());
    }
    return words;
  }
  return {};
}